

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p3ch18ex11.cpp
# Opt level: O1

void __thiscall SkipList::Remove(SkipList *this,int inKey)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Node *pNVar2;
  pointer pcVar3;
  Node *pNVar4;
  Node *nodeCopy;
  
  pNVar4 = Find(this,inKey);
  if (pNVar4 != (Node *)0x0) {
    if (pNVar4->top != (Node *)0x0) {
      __assert_fail("(node->top == nullptr) && \"Found node is not at the top level!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/vocasle[P]principles_and_practice_using_cpp/part_3_data_and_algorithms/ch_18/p3ch18ex11.cpp"
                    ,0xe6,"void SkipList::Remove(int)");
    }
    if (1 < pNVar4->key + 0x80000001U) {
      do {
        pNVar2 = pNVar4->prev;
        pNVar2->next = pNVar4->next;
        pNVar4->next->prev = pNVar2;
        pNVar2 = pNVar4->bot;
        pcVar3 = (pNVar4->val)._M_dataplus._M_p;
        paVar1 = &(pNVar4->val).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 != paVar1) {
          operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
        }
        operator_delete(pNVar4,0x48);
        pNVar4 = pNVar2;
      } while (pNVar2 != (Node *)0x0);
      this->size = this->size + -1;
    }
  }
  return;
}

Assistant:

void SkipList::Remove(int inKey)
{
	Node* node = Find(inKey);
	if (node)
	{
		assert((node->top == nullptr) && "Found node is not at the top level!");
		if (node->key == TRAILER_KEY || node->key == HEADER_KEY)
		{
			return;
		}
		while(node)
		{
			Node* nodeCopy = node;
			node->prev->next = node->next;
			node->next->prev = node->prev;
			node = node->bot;
			delete nodeCopy;
		}
		--size;
	}
}